

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

string * __thiscall
Catch::toString_abi_cxx11_(string *__return_storage_ptr__,Catch *this,bool value)

{
  char *pcVar1;
  
  pcVar1 = "file->found == false";
  if ((int)this != 0) {
    pcVar1 = "file->found == true";
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,pcVar1 + 0xf,
             pcVar1 + 0xf + ((ulong)this & 0xffffffff ^ 5));
  return __return_storage_ptr__;
}

Assistant:

std::string toString( bool value ) {
    return value ? "true" : "false";
}